

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O0

void swap_pointer(zmaxheap_t *heap,int a,int b)

{
  float fVar1;
  char *pcVar2;
  undefined8 uVar3;
  void *tmp;
  void **pp;
  float t;
  int b_local;
  int a_local;
  zmaxheap_t *heap_local;
  
  fVar1 = heap->values[a];
  heap->values[a] = heap->values[b];
  heap->values[b] = fVar1;
  pcVar2 = heap->data;
  uVar3 = *(undefined8 *)(pcVar2 + (long)a * 8);
  *(undefined8 *)(pcVar2 + (long)a * 8) = *(undefined8 *)(pcVar2 + (long)b * 8);
  *(undefined8 *)(pcVar2 + (long)b * 8) = uVar3;
  return;
}

Assistant:

static inline void swap_pointer(zmaxheap_t *heap, int a, int b)
{
    float t = heap->values[a];
    heap->values[a] = heap->values[b];
    heap->values[b] = t;

    void **pp = (void**) heap->data;
    void *tmp = pp[a];
    pp[a] = pp[b];
    pp[b] = tmp;
}